

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O2

unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
MCTS::compute_tree<NimState>(TestGame root_state,ComputeOptions options,result_type initial_seed)

{
  int *state;
  bool bVar1;
  Node<NimState> *this;
  Node<NimState> *this_00;
  runtime_error *this_01;
  undefined8 uVar2;
  int iVar3;
  double dVar4;
  Move move;
  tuple<MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_> local_a10;
  TestGame root_state_local;
  int iStack_9fc;
  mt19937_64 random_engine;
  
  uVar2._4_4_ = (int)((ulong)register0x00000030 >> 0x20);
  uVar2._0_4_ = root_state.X;
  root_state_local._0_8_ = uVar2;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&random_engine,initial_seed);
  if ((options.max_iterations < 0) && (options.max_time < 0.0)) {
    assertion_failed("options.max_iterations >= 0 || options.max_time >= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x135);
  }
  if (0.0 <= options.max_time) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < (int)uVar2 - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x13c);
  }
  this = (Node<NimState> *)operator_new(0x60);
  Node<NimState>::Node(this,&root_state_local);
  *(Node<NimState> **)root_state._0_8_ = this;
  iVar3 = 1;
  state = &root_state_local.X;
  local_a10.
  super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>.
  super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>)
       root_state._0_8_;
  do {
    if (iVar3 == options.max_iterations + 1) {
      return (__uniq_ptr_data<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>,_true,_true>
              )(tuple<MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>)
               local_a10.
               super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>
               .super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl;
    }
    root_state_local.X = root_state_local.player_to_move;
    iStack_9fc = root_state_local.winner;
    this_00 = this;
    while ((this_00->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (this_00->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      if ((this_00->children).
          super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this_00->children).
          super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_00151812;
      this_00 = Node<NimState>::select_child_UCT(this_00);
      NimState::do_move((NimState *)state,this_00->move);
    }
    move = Node<NimState>::
           get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (this_00,&random_engine);
    NimState::do_move((NimState *)state,move);
    this_00 = Node<NimState>::add_child(this_00,&move,(TestGame *)state);
LAB_00151812:
    while( true ) {
      bVar1 = NimState::has_moves((NimState *)state);
      if (!bVar1) break;
      NimState::
      do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                ((NimState *)state,&random_engine);
    }
    for (; this_00 != (Node<NimState> *)0x0; this_00 = this_00->parent) {
      dVar4 = NimState::get_result((NimState *)state,this_00->player_to_move);
      this_00->visits = this_00->visits + 1;
      this_00->wins = dVar4 + this_00->wins;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}